

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_attach_connection(Curl_easy *data,connectdata *conn)

{
  connectdata *conn_local;
  Curl_easy *data_local;
  
  data->conn = conn;
  Curl_llist_insert_next(&conn->easyq,(conn->easyq).tail,data,&data->conn_queue);
  if ((conn->handler != (Curl_handler *)0x0) &&
     (conn->handler->attach != (_func_void_Curl_easy_ptr_connectdata_ptr *)0x0)) {
    (*conn->handler->attach)(data,conn);
  }
  Curl_conn_ev_data_attach(conn,data);
  return;
}

Assistant:

void Curl_attach_connection(struct Curl_easy *data,
                             struct connectdata *conn)
{
  DEBUGASSERT(!data->conn);
  DEBUGASSERT(conn);
  data->conn = conn;
  Curl_llist_insert_next(&conn->easyq, conn->easyq.tail, data,
                         &data->conn_queue);
  if(conn->handler && conn->handler->attach)
    conn->handler->attach(data, conn);
  Curl_conn_ev_data_attach(conn, data);
}